

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PieceWiseLinearCalib.cpp
# Opt level: O1

void __thiscall
tactile::PieceWiseLinearCalib::PieceWiseLinearCalib
          (PieceWiseLinearCalib *this,CalibrationMap *values)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_Calibration)._vptr_Calibration = (_func_int **)&PTR__PieceWiseLinearCalib_00108d58;
  p_Var1 = &(this->values)._M_t._M_impl.super__Rb_tree_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Range::init(&this->range,(EVP_PKEY_CTX *)values);
  init(this,(EVP_PKEY_CTX *)values);
  return;
}

Assistant:

PieceWiseLinearCalib::PieceWiseLinearCalib(const CalibrationMap &values)
{
	init(values);
}